

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment_two_pass.cpp
# Opt level: O2

void BrotliCompressFragmentTwoPassImpl10
               (BrotliTwoPassArena *s,uint8_t *input,size_t input_size,int is_last,
               uint32_t *command_buf,uint8_t *literal_buf,int *table,size_t *storage_ix,
               uint8_t *storage)

{
  long *plVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  size_t input_size_00;
  uint8_t *puVar5;
  ulong *puVar6;
  byte bVar7;
  uint uVar8;
  undefined4 in_register_0000000c;
  uint32_t *commands;
  long *plVar9;
  long lVar10;
  int *piVar11;
  int iVar12;
  ulong *puVar13;
  long *plVar14;
  long *input_00;
  long *__src;
  long *__src_00;
  ulong uVar15;
  uint uVar16;
  long *plVar17;
  ulong uVar18;
  uint32_t *__dest;
  int iVar19;
  uint32_t *puVar20;
  bool bVar21;
  long lStackY_a0;
  int local_8c;
  
  commands = (uint32_t *)CONCAT44(in_register_0000000c,is_last);
  input_00 = (long *)input;
  while( true ) {
    if (input_size == 0) {
      return;
    }
    input_size_00 = 0x20000;
    if (input_size < 0x20000) {
      input_size_00 = input_size;
    }
    plVar1 = (long *)((long)input_00 + input_size_00);
    __src = input_00;
    __dest = command_buf;
    puVar20 = commands;
    if (0xf < input_size) break;
LAB_01e5b993:
    if (__src < plVar1) {
      uVar8 = (uint)((long)plVar1 - (long)__src);
      if (5 < uVar8) {
        if (uVar8 < 0x82) {
          uVar8 = uVar8 - 2;
          uVar3 = 0x1f;
          if (uVar8 != 0) {
            for (; uVar8 >> uVar3 == 0; uVar3 = uVar3 - 1) {
            }
          }
          bVar7 = (char)(uVar3 ^ 0xffffffe0) + 0x1f;
          uVar4 = uVar8 >> (bVar7 & 0x1f);
          uVar8 = (uVar8 - (uVar4 << (bVar7 & 0x1f))) * 0x100 |
                  uVar4 + (uVar3 ^ 0xffffffe0) * 2 + 0x40;
        }
        else if (uVar8 < 0x842) {
          uVar3 = 0x1f;
          if (uVar8 - 0x42 != 0) {
            for (; uVar8 - 0x42 >> uVar3 == 0; uVar3 = uVar3 - 1) {
            }
          }
          uVar8 = (((-1 << ((byte)uVar3 & 0x1f)) + uVar8 + -0x42) * 0x100 - (uVar3 ^ 0x1f)) + 0x29;
        }
        else {
          iVar12 = uVar8 * 0x100;
          if (uVar8 < 0x1842) {
            uVar8 = iVar12 - 0x841eb;
          }
          else if (uVar8 < 0x5842) {
            uVar8 = iVar12 - 0x1841ea;
          }
          else {
            uVar8 = iVar12 - 0x5841e9;
          }
        }
      }
      *puVar20 = uVar8;
      puVar20 = puVar20 + 1;
      uVar15 = (long)plVar1 - (long)__src & 0xffffffff;
      switchD_01939fa4::default(__dest,__src,uVar15);
      __dest = (uint32_t *)((long)__dest + uVar15);
    }
    iVar12 = ShouldCompress(s,(uint8_t *)input_00,input_size_00,(long)__dest - (long)command_buf);
    if (iVar12 == 0) {
      EmitUncompressedMetaBlock
                ((uint8_t *)input_00,input_size_00,(size_t *)table,(uint8_t *)storage_ix);
    }
    else {
      BrotliStoreMetaBlockHeader(input_size_00,0,(size_t *)table,(uint8_t *)storage_ix);
      uVar15 = *(ulong *)table;
      uVar18 = uVar15 >> 3;
      *(ulong *)((long)storage_ix + uVar18) = (ulong)*(byte *)((long)storage_ix + uVar18);
      *(ulong *)table = uVar15 + 0xd;
      StoreCommands(s,(uint8_t *)command_buf,(long)__dest - (long)command_buf,commands,
                    (long)puVar20 - (long)commands >> 2,(size_t *)table,(uint8_t *)storage_ix);
    }
    input_size = input_size - input_size_00;
    input_00 = plVar1;
  }
  uVar15 = input_size - 0x10;
  if (input_size_00 - 4 < input_size - 0x10) {
    uVar15 = input_size_00 - 4;
  }
  plVar9 = (long *)(uVar15 + (long)input_00);
  local_8c = -1;
  __src_00 = input_00;
LAB_01e5b4c3:
  lVar10 = *(long *)((long)__src_00 + 1);
  uVar15 = 0x20;
  plVar14 = (long *)((long)__src_00 + 1);
  do {
    plVar17 = (long *)((uVar15 >> 5) + (long)plVar14);
    __src = __src_00;
    if (plVar9 < plVar17) goto LAB_01e5b993;
    uVar18 = (ulong)(lVar10 * 0x1e35a7bd00000000) >> 0x36;
    lVar10 = *plVar17;
    iVar12 = (int)plVar14;
    iVar19 = (int)input;
    if (((int)*plVar14 == *(int *)((long)plVar14 + -(long)local_8c)) && (0 < local_8c)) {
      puVar5 = (uint8_t *)(-(long)local_8c + (long)plVar14);
      *(int *)(literal_buf + uVar18 * 4) = iVar12 - iVar19;
LAB_01e5b535:
      if ((long)plVar14 - (long)puVar5 < 0x3fff1) break;
    }
    else {
      iVar2 = *(int *)(literal_buf + uVar18 * 4);
      *(int *)(literal_buf + uVar18 * 4) = iVar12 - iVar19;
      if ((int)*plVar14 == *(int *)(input + iVar2)) {
        puVar5 = input + iVar2;
        goto LAB_01e5b535;
      }
    }
    uVar15 = (ulong)((int)uVar15 + 1);
    plVar14 = plVar17;
  } while( true );
  puVar6 = (ulong *)(puVar5 + 4);
  puVar13 = (ulong *)((long)plVar14 + 4);
  uVar15 = (long)plVar1 + (-4 - (long)plVar14);
  lVar10 = 0;
LAB_01e5b55d:
  if (uVar15 < 8) {
    for (uVar18 = 0;
        (uVar15 != uVar18 && (*(char *)((long)puVar6 + uVar18) == *(char *)((long)puVar13 + uVar18))
        ); uVar18 = uVar18 + 1) {
    }
  }
  else {
    if (*puVar13 == *puVar6) goto code_r0x01e5b56e;
    uVar18 = *puVar6 ^ *puVar13;
    uVar15 = 0;
    if (uVar18 != 0) {
      for (; (uVar18 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
      }
    }
    uVar18 = uVar15 >> 3 & 0x1fffffff;
  }
  lVar10 = uVar18 - lVar10;
  uVar3 = iVar12 - (int)__src_00;
  uVar8 = uVar3;
  if (5 < uVar3) {
    if (uVar3 < 0x82) {
      uVar4 = uVar3 - 2;
      uVar8 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> uVar8 == 0; uVar8 = uVar8 - 1) {
        }
      }
      bVar7 = (char)(uVar8 ^ 0xffffffe0) + 0x1f;
      uVar16 = uVar4 >> (bVar7 & 0x1f);
      uVar8 = (uVar4 - (uVar16 << (bVar7 & 0x1f))) * 0x100 |
              uVar16 + (uVar8 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (uVar3 < 0x842) {
      uVar8 = 0x1f;
      if (uVar3 - 0x42 != 0) {
        for (; uVar3 - 0x42 >> uVar8 == 0; uVar8 = uVar8 - 1) {
        }
      }
      uVar8 = (((-1 << ((byte)uVar8 & 0x1f)) + uVar3 + -0x42) * 0x100 - (uVar8 ^ 0x1f)) + 0x29;
    }
    else {
      iVar12 = uVar3 * 0x100;
      if (uVar3 < 0x1842) {
        uVar8 = iVar12 - 0x841eb;
      }
      else if (uVar3 < 0x5842) {
        uVar8 = iVar12 - 0x1841ea;
      }
      else {
        uVar8 = iVar12 - 0x5841e9;
      }
    }
  }
  *puVar20 = uVar8;
  switchD_01939fa4::default(__dest,__src_00,(long)(int)uVar3);
  uVar8 = 0x40;
  iVar12 = (int)((long)plVar14 - (long)puVar5);
  if (local_8c != iVar12) {
    uVar4 = iVar12 + 3;
    uVar8 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> uVar8 == 0; uVar8 = uVar8 - 1) {
      }
    }
    bVar7 = 0x1e - (char)(uVar8 ^ 0x1f);
    bVar21 = (uVar4 >> (bVar7 & 0x1f) & 1) != 0;
    uVar8 = (uint)bVar21 +
            ((uVar4 - (bVar21 + 2 << (bVar7 & 0x1f))) * 0x100 | (uVar8 ^ 0x1f) * 2 ^ 0x3e) + 0x4c;
    local_8c = iVar12;
  }
  uVar15 = lVar10 + 4;
  puVar20[1] = uVar8;
  if (uVar15 < 0xc) {
    uVar8 = (int)uVar15 + 0x14;
  }
  else {
    if (0x47 < uVar15) {
      if (uVar15 < 0x88) {
        puVar20[2] = ((uint)(lVar10 - 4U) & 0x1f) << 8 | (int)(lVar10 - 4U >> 5) + 0x36U;
        puVar20[3] = 0x40;
        lStackY_a0 = 0x10;
      }
      else {
        if (uVar15 < 0x848) {
          uVar8 = (int)lVar10 - 0x44;
          iVar12 = 0x1f;
          if (uVar8 != 0) {
            for (; uVar8 >> iVar12 == 0; iVar12 = iVar12 + -1) {
            }
          }
          puVar20[2] = ((int)(-1L << ((byte)iVar12 & 0x3f)) + (int)lVar10 + -0x44) * 0x100 + iVar12
                       + 0x34;
        }
        else {
          puVar20[2] = (int)uVar15 * 0x100 - 0x847c1;
        }
        puVar20[3] = 0x40;
        lStackY_a0 = 0x10;
      }
      goto LAB_01e5b6df;
    }
    uVar8 = 0x1f;
    uVar4 = (uint)(lVar10 - 4U);
    if (uVar4 != 0) {
      for (; uVar4 >> uVar8 == 0; uVar8 = uVar8 - 1) {
      }
    }
    bVar7 = (char)(uVar8 ^ 0xffffffe0) + 0x1f;
    iVar12 = (int)(lVar10 - 4U >> (bVar7 & 0x3f));
    uVar8 = (uVar4 - (iVar12 << (bVar7 & 0x1f))) * 0x100 | iVar12 + (uVar8 ^ 0xffffffe0) * 2 + 0x5a;
  }
  puVar20[2] = uVar8;
  lStackY_a0 = 0xc;
LAB_01e5b6df:
  __src = (long *)((long)plVar14 + lVar10 + 4);
  __dest = (uint32_t *)((long)__dest + (long)(int)uVar3);
  puVar20 = (uint32_t *)((long)puVar20 + lStackY_a0);
  if (plVar9 <= __src) goto LAB_01e5b993;
  uVar15 = *(ulong *)((long)plVar14 + lVar10 + 1);
  iVar12 = (int)__src - iVar19;
  *(int *)(literal_buf + ((uVar15 & 0xffffffff00) * 0x1e35a7bd000000 >> 0x36) * 4) = iVar12 + -2;
  *(int *)(literal_buf + (uVar15 * 0x1e35a7bd00000000 >> 0x36) * 4) = iVar12 + -1;
  __src_00 = __src;
  while( true ) {
    uVar15 = (uVar15 & 0xffffffff000000) * 0x1e35a7bd00 >> 0x36;
    iVar2 = *(int *)(literal_buf + uVar15 * 4);
    *(int *)(literal_buf + uVar15 * 4) = iVar12;
    piVar11 = (int *)(input + iVar2);
    if ((0x3fff0 < (long)__src_00 - (long)piVar11) || ((int)*__src_00 != *piVar11)) break;
    puVar6 = (ulong *)(piVar11 + 1);
    puVar13 = (ulong *)((long)__src_00 + 4);
    uVar15 = (long)plVar1 + (-4 - (long)__src_00);
    lVar10 = 0;
LAB_01e5b788:
    if (uVar15 < 8) {
      for (uVar18 = 0;
          (uVar15 != uVar18 &&
          (*(char *)((long)puVar6 + uVar18) == *(char *)((long)puVar13 + uVar18)));
          uVar18 = uVar18 + 1) {
      }
    }
    else {
      if (*puVar13 == *puVar6) goto code_r0x01e5b799;
      uVar18 = *puVar6 ^ *puVar13;
      uVar15 = 0;
      if (uVar18 != 0) {
        for (; (uVar18 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
        }
      }
      uVar18 = uVar15 >> 3 & 0x1fffffff;
    }
    lVar10 = uVar18 - lVar10;
    uVar15 = lVar10 + 4;
    if (uVar15 < 10) {
      uVar8 = (int)uVar15 + 0x26;
    }
    else if (uVar15 < 0x86) {
      uVar8 = 0x1f;
      uVar3 = (uint)(lVar10 - 2U);
      if (uVar3 != 0) {
        for (; uVar3 >> uVar8 == 0; uVar8 = uVar8 - 1) {
        }
      }
      bVar7 = (char)(uVar8 ^ 0xffffffe0) + 0x1f;
      iVar12 = (int)(lVar10 - 2U >> (bVar7 & 0x3f));
      uVar8 = (uVar3 - (iVar12 << (bVar7 & 0x1f))) * 0x100 |
              iVar12 + (uVar8 ^ 0xffffffe0) * 2 + 0x6a;
    }
    else if (uVar15 < 0x846) {
      uVar8 = (int)lVar10 - 0x42;
      iVar12 = 0x1f;
      if (uVar8 != 0) {
        for (; uVar8 >> iVar12 == 0; iVar12 = iVar12 + -1) {
        }
      }
      uVar8 = ((int)(-1L << ((byte)iVar12 & 0x3f)) + (int)lVar10 + -0x42) * 0x100 + iVar12 + 0x34;
    }
    else {
      uVar8 = (int)uVar15 * 0x100 - 0x845c1;
    }
    __src = (long *)((long)__src_00 + lVar10 + 4);
    *puVar20 = uVar8;
    local_8c = (int)((long)__src_00 - (long)piVar11);
    uVar3 = local_8c + 3;
    uVar8 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar8 == 0; uVar8 = uVar8 - 1) {
      }
    }
    bVar7 = 0x1e - (char)(uVar8 ^ 0x1f);
    bVar21 = (uVar3 >> (bVar7 & 0x1f) & 1) != 0;
    puVar20[1] = (uint)bVar21 +
                 ((uVar3 - (bVar21 + 2 << (bVar7 & 0x1f))) * 0x100 | (uVar8 ^ 0x1f) * 2 ^ 0x3e) +
                 0x4c;
    puVar20 = puVar20 + 2;
    if (plVar9 <= __src) goto LAB_01e5b993;
    uVar15 = *(ulong *)((long)__src_00 + lVar10 + 1);
    iVar12 = (int)__src - iVar19;
    *(int *)(literal_buf + (uVar15 * 0x1e35a7bd00000000 >> 0x36) * 4) = iVar12 + -3;
    *(int *)(literal_buf + ((uVar15 & 0xffffffff00) * 0x1e35a7bd000000 >> 0x36) * 4) = iVar12 + -2;
    *(int *)(literal_buf + ((uVar15 & 0xffffffff0000) * 0x1e35a7bd0000 >> 0x36) * 4) = iVar12 + -1;
    __src_00 = __src;
  }
  goto LAB_01e5b4c3;
code_r0x01e5b56e:
  puVar13 = puVar13 + 1;
  puVar6 = puVar6 + 1;
  uVar15 = uVar15 - 8;
  lVar10 = lVar10 + -8;
  goto LAB_01e5b55d;
code_r0x01e5b799:
  puVar13 = puVar13 + 1;
  puVar6 = puVar6 + 1;
  uVar15 = uVar15 - 8;
  lVar10 = lVar10 + -8;
  goto LAB_01e5b788;
}

Assistant:

void duckdb_brotli::BrotliCompressFragmentTwoPass(
    BrotliTwoPassArena* s, const uint8_t* input, size_t input_size,
    BROTLI_BOOL is_last, uint32_t* command_buf, uint8_t* literal_buf,
    int* table, size_t table_size, size_t* storage_ix, uint8_t* storage) {
  const size_t initial_storage_ix = *storage_ix;
  const size_t table_bits = Log2FloorNonZero(table_size);
  switch (table_bits) {
#define CASE_(B)                                      \
    case B:                                           \
      BrotliCompressFragmentTwoPassImpl ## B(         \
          s, input, input_size, is_last, command_buf, \
          literal_buf, table, storage_ix, storage);   \
      break;
    FOR_TABLE_BITS_(CASE_)
#undef CASE_
    default: BROTLI_DCHECK(0); break;
  }

  /* If output is larger than single uncompressed block, rewrite it. */
  if (*storage_ix - initial_storage_ix > 31 + (input_size << 3)) {
    RewindBitPosition(initial_storage_ix, storage_ix, storage);
    EmitUncompressedMetaBlock(input, input_size, storage_ix, storage);
  }

  if (is_last) {
    BrotliWriteBits(1, 1, storage_ix, storage);  /* islast */
    BrotliWriteBits(1, 1, storage_ix, storage);  /* isempty */
    *storage_ix = (*storage_ix + 7u) & ~7u;
  }
}